

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Transfer_Control_Request_PDU
          (Transfer_Control_Request_PDU *this,KUINT32 ReqID,RequiredReliabilityService RRS,
          TransferType TT,EntityIdentifier *TrnsEntID)

{
  KUINT16 KVar1;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transfer_Control_Request_PDU_00214990;
  this->m_ui32ReqID = ReqID;
  this->m_ui8ReqRelSrv = (KUINT8)RRS;
  this->m_ui8TrnTyp = (KUINT8)TT;
  (this->m_TrnsEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00213bc8;
  KVar1 = (TrnsEntID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_TrnsEntID).super_SimulationIdentifier.m_ui16SiteID =
       (TrnsEntID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_TrnsEntID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_TrnsEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00213ad0;
  *(undefined2 *)&(this->m_TrnsEntID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(TrnsEntID->super_SimulationIdentifier).field_0xc;
  this->m_ui32NumRecSets = 0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vRecs).
  super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '#';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  return;
}

Assistant:

Transfer_Control_Request_PDU::Transfer_Control_Request_PDU( KUINT32 ReqID, RequiredReliabilityService RRS, TransferType TT, const EntityIdentifier & TrnsEntID ) :
    m_ui32ReqID( ReqID ),
    m_ui8ReqRelSrv( RRS ),
    m_ui8TrnTyp( TT ),
    m_TrnsEntID( TrnsEntID ),
    m_ui32NumRecSets( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = TransferControl_PDU_Type;
    m_ui16PDULength = TRANSFER_CONTROL_REQUEST_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}